

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AtomEscapePass1
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  EncodedChar **p;
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  undefined4 *puVar8;
  Node *pNVar9;
  byte *pbVar10;
  Char CVar11;
  uint uVar12;
  EncodedChar cc;
  CharCount n;
  ulong uVar13;
  CharCount i;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  byte *pbVar18;
  CharCount i_1;
  int iVar19;
  ulong uVar20;
  Char local_32 [4];
  Char c;
  
  pbVar10 = this->inputLim;
  pbVar18 = this->next;
  if (pbVar10 <= pbVar18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x643,"(!IsEOF())","!IsEOF()");
    if (!bVar3) goto LAB_00ed8611;
    *puVar8 = 0;
    pbVar10 = this->inputLim;
    pbVar18 = this->next;
  }
  p = &this->next;
  if (pbVar10 < pbVar18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ed8611;
    *puVar8 = 0;
    pbVar18 = *p;
  }
  bVar4 = *pbVar18;
  uVar16 = (ulong)bVar4;
  if ((ASCIIChars::classes[uVar16] & 0x10) != 0) {
    if (this->inputLim < pbVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ed8611;
      *puVar8 = 0;
      pbVar18 = *p;
      uVar16 = (ulong)*pbVar18;
    }
    if ((char)uVar16 == '0') {
      pbVar10 = this->inputLim;
      uVar16 = 0x30;
    }
    else {
      iVar19 = 0;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar14 = 2;
      do {
        lVar15 = lVar14;
        pbVar10 = this->inputLim;
        if (pbVar10 < pbVar18 + lVar15 + -2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ed8611;
          *puVar8 = 0;
          pbVar10 = this->inputLim;
          pbVar18 = this->next;
          uVar16 = (ulong)pbVar18[lVar15 + -2];
        }
        iVar19 = (uint)(byte)ASCIIChars::values[uVar16] + iVar19 * 10;
        if (lVar15 == 6) {
          uVar16 = 5;
          goto LAB_00ed7b3c;
        }
        if (pbVar10 < pbVar18 + lVar15) {
          uVar16 = lVar15 - 1;
          goto LAB_00ed7b3c;
        }
        if (pbVar10 < pbVar18 + lVar15 + -1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ed8611;
          *puVar8 = 0;
          pbVar18 = *p;
        }
        uVar16 = (ulong)pbVar18[lVar15 + -1];
        lVar14 = lVar15 + 1;
      } while ((ASCIIChars::classes[uVar16] & 0x10) != 0);
      pbVar10 = this->inputLim;
      uVar16 = lVar15 - 1;
LAB_00ed7b3c:
      if (iVar19 < (int)(uint)this->numGroups) {
        uVar13 = uVar16 & 0xffffffff;
        if (pbVar18 + lVar15 <= pbVar10) {
          if (pbVar10 < pbVar18 + uVar13) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar3) goto LAB_00ed8611;
            *puVar8 = 0;
            pbVar10 = this->inputLim;
            pbVar18 = this->next;
          }
          if ((ASCIIChars::classes[pbVar18[uVar13]] & 0x10) != 0) goto LAB_00ed7cf6;
        }
        if (pbVar10 < pbVar18 + uVar13) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ed8611;
          *puVar8 = 0;
        }
        uVar20 = 0;
        do {
          if ((char)(*p)[uVar20] < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                               "!this->IsMultiUnitChar(next[i])");
            if (!bVar3) goto LAB_00ed8611;
            *puVar8 = 0;
          }
          uVar20 = uVar20 + 1;
          if (uVar16 == uVar20) {
            this->next = this->next + uVar13;
            pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x364470);
            pNVar9->tag = MatchGroup;
            pNVar9->features = 0;
            *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
            pNVar9->firstSet = (CharSet<char16_t> *)0x0;
            pNVar9->followSet = (CharSet<char16_t> *)0x0;
            (pNVar9->prevConsumes).lower = 0;
            *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
            *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
            (pNVar9->followConsumes).upper = 0xffffffff;
            pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542e70;
            *(int *)&pNVar9[1]._vptr_Node = iVar19;
            *node = pNVar9;
            return false;
          }
        } while( true );
      }
LAB_00ed7cf6:
      if (pbVar10 < pbVar18) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ed8611;
        *puVar8 = 0;
        pbVar10 = this->inputLim;
        pbVar18 = this->next;
      }
      uVar16 = (ulong)*pbVar18;
      if ((ASCIIChars::classes[uVar16] & 0x20) == 0) {
        if (pbVar10 < pbVar18) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ed8611;
          *puVar8 = 0;
          pbVar10 = this->inputLim;
          pbVar18 = this->next;
          uVar16 = (ulong)*pbVar18;
        }
        deferredCharNode->cs[0] = (Char)uVar16;
        if (pbVar10 < pbVar18 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ed8611;
          *puVar8 = 0;
          pbVar18 = *p;
        }
        if (-1 < (char)*pbVar18) {
LAB_00ed7e6c:
          *p = pbVar18 + 1;
          *node = &deferredCharNode->super_Node;
          return false;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (bVar3) {
          *puVar8 = 0;
          pbVar18 = *p;
          goto LAB_00ed7e6c;
        }
        goto LAB_00ed8611;
      }
    }
    if (pbVar10 < pbVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ed8611;
      *puVar8 = 0;
      pbVar18 = *p;
      uVar16 = (ulong)*pbVar18;
    }
    if ((ASCIIChars::classes[uVar16] & 0x20) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x670,"(standardEncodedChars->IsOctal(ECLookahead()))",
                         "standardEncodedChars->IsOctal(ECLookahead())");
      if (!bVar3) {
LAB_00ed8611:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      pbVar18 = *p;
    }
    else {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    iVar19 = 3;
    uVar17 = 0;
    do {
      if (this->inputLim < pbVar18) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ed8611;
        *puVar8 = 0;
        pbVar18 = *p;
      }
      bVar4 = *pbVar18;
      uVar12 = (uint)(byte)ASCIIChars::values[bVar4] + uVar17 * 8;
      if (0xff < uVar12) break;
      if (this->inputLim < pbVar18 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ed8611;
        *puVar8 = 0;
        pbVar18 = *p;
        bVar4 = *pbVar18;
      }
      if ((char)bVar4 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar3) goto LAB_00ed8611;
        *puVar8 = 0;
        pbVar18 = *p;
      }
      pbVar18 = pbVar18 + 1;
      *p = pbVar18;
      iVar19 = iVar19 + -1;
      uVar17 = uVar12;
      if (iVar19 == 0) break;
      if (this->inputLim < pbVar18) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ed8611;
        *puVar8 = 0;
        pbVar18 = *p;
      }
    } while ((ASCIIChars::classes[*pbVar18] & 0x20) != 0);
    deferredCharNode->cs[0] = (Char)uVar17;
LAB_00ed81c5:
    *node = &deferredCharNode->super_Node;
    return false;
  }
  if (this->inputLim < pbVar18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ed8611;
    *puVar8 = 0;
    pbVar18 = *p;
    bVar4 = *pbVar18;
  }
  if (bVar4 == 99) {
    if (this->inputLim < pbVar18 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ed8611;
      *puVar8 = 0;
      pbVar18 = *p;
    }
    bVar4 = pbVar18[1];
    CVar11 = L'\\';
    if ((ASCIIChars::classes[bVar4] & 8) != 0) {
      pbVar10 = this->inputLim;
      if (pbVar10 < pbVar18 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ed8611;
        *puVar8 = 0;
        pbVar10 = this->inputLim;
        pbVar18 = this->next;
        bVar4 = pbVar18[1];
      }
      if (pbVar10 < pbVar18 + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ed8611;
        *puVar8 = 0;
      }
      else {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      }
      lVar14 = 0;
      do {
        if ((char)(*p)[lVar14] < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar3) goto LAB_00ed8611;
          *puVar8 = 0;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 2);
      *p = *p + 2;
      CVar11 = (Char)(bVar4 & 0x1f);
    }
    deferredCharNode->cs[0] = CVar11;
    goto LAB_00ed81c5;
  }
  pbVar10 = this->inputLim;
  if (pbVar10 <= pbVar18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar3) goto LAB_00ed8611;
    *puVar8 = 0;
    pbVar10 = this->inputLim;
  }
  local_32[0] = UTF8EncodingPolicyBase<false>::ReadFull<true>
                          (&this->super_UTF8EncodingPolicyBase<false>,p,pbVar10);
  if ((ushort)local_32[0] < 0x100) {
    if ((ASCIIChars::classes[(ushort)local_32[0]] & 2) != 0) {
LAB_00ed7abf:
      Fail(this,-0x7ff5fc0c);
    }
  }
  else if ((local_32[0] & 0xfffeU) == 0x2028) goto LAB_00ed7abf;
  switch(local_32[0]) {
  case L'S':
    cc = 'S';
    goto LAB_00ed8562;
  case L'T':
  case L'U':
  case L'V':
  case L'X':
  case L'Y':
  case L'Z':
  case L'_':
  case L'`':
  case L'a':
  case L'c':
  case L'e':
  case L'g':
  case L'h':
  case L'i':
  case L'j':
  case L'k':
  case L'l':
  case L'm':
  case L'o':
  case L'p':
  case L'q':
  case L'y':
  case L'z':
    goto switchD_00ed7aec_caseD_54;
  case L'W':
    cc = 'W';
LAB_00ed8562:
    deferredCharNode = (MatchCharNode *)GetNodeWithValidCharacterSet(this,cc);
    goto LAB_00ed7b2d;
  case L'[':
  case L'\\':
  case L']':
  case L'^':
  case L'{':
  case L'|':
  case L'}':
    break;
  case L'b':
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x364470)
    ;
    (((MatchSetNode *)deferredCharNode)->super_Node).tag = WordBoundary;
    (((MatchSetNode *)deferredCharNode)->super_Node).features = 0;
    puVar1 = &(((MatchSetNode *)deferredCharNode)->super_Node).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
    (((MatchSetNode *)deferredCharNode)->super_Node).firstSet = (CharSet<char16_t> *)0x0;
    (((MatchSetNode *)deferredCharNode)->super_Node).followSet = (CharSet<char16_t> *)0x0;
    (((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.lower = 0;
    *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.upper = 0xffffffff
    ;
    *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).thisConsumes.upper = 0xffffffff
    ;
    (((MatchSetNode *)deferredCharNode)->super_Node).followConsumes.upper = 0xffffffff;
    (((MatchSetNode *)deferredCharNode)->super_Node)._vptr_Node =
         (_func_int **)&PTR_LiteralLength_01542850;
    ((MatchSetNode *)deferredCharNode)->isNegation = false;
    ((MatchSetNode *)deferredCharNode)->needsEquivClass = false;
LAB_00ed85ec:
    ((MatchSetNode *)deferredCharNode)->field_0x3a = 0;
    bVar3 = true;
    goto LAB_00ed7b30;
  case L'd':
    bVar3 = false;
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x364470)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetDigits
              (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    goto LAB_00ed7b30;
  case L'f':
    local_32[0] = L'\f';
    break;
  case L'n':
    local_32[0] = L'\n';
    break;
  case L'r':
    local_32[0] = L'\r';
    break;
  case L's':
    bVar3 = false;
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x364470)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetWhitespace
              (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    goto LAB_00ed7b30;
  case L't':
    local_32[0] = L'\t';
    break;
  case L'u':
    if ((((this->unicodeFlagPresent != true) ||
         (iVar19 = TryParseExtendedUnicodeEscape(this,local_32,previousSurrogatePart,false),
         iVar19 < 1)) &&
        ((this->next + 4 <= this->inputLim &&
         (((bVar4 = ECLookahead(this,0), (ASCIIChars::classes[bVar4] & 0x40) != 0 &&
           (bVar4 = ECLookahead(this,1), (ASCIIChars::classes[bVar4] & 0x40) != 0)) &&
          (bVar4 = ECLookahead(this,2), (ASCIIChars::classes[bVar4] & 0x40) != 0)))))) &&
       (bVar4 = ECLookahead(this,3), (ASCIIChars::classes[bVar4] & 0x40) != 0)) {
      bVar4 = ECLookahead(this,0);
      bVar4 = ASCIIChars::values[bVar4];
      bVar5 = ECLookahead(this,1);
      bVar5 = ASCIIChars::values[bVar5];
      bVar6 = ECLookahead(this,2);
      bVar6 = ASCIIChars::values[bVar6];
      bVar7 = ECLookahead(this,3);
      local_32[0] = Chars<char16_t>::UTC
                              ((uint)(byte)ASCIIChars::values[bVar7] | (uint)bVar6 << 4 |
                               (uint)bVar5 << 8 | (uint)bVar4 << 0xc);
      n = 4;
LAB_00ed8302:
      ECConsume(this,n);
    }
    break;
  case L'v':
    local_32[0] = L'\v';
    break;
  case L'w':
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x364470)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    if ((this->unicodeFlagPresent == true) && (this->caseInsensitiveFlagPresent == true)) {
      StandardChars<char16_t>::SetWordIUChars
                (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    }
    else {
      StandardChars<char16_t>::SetWordChars
                (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    }
    goto LAB_00ed7b2d;
  case L'x':
    if (((this->next + 2 <= this->inputLim) &&
        (bVar4 = ECLookahead(this,0), (ASCIIChars::classes[bVar4] & 0x40) != 0)) &&
       (bVar4 = ECLookahead(this,1), (ASCIIChars::classes[bVar4] & 0x40) != 0)) {
      bVar4 = ECLookahead(this,0);
      bVar4 = ASCIIChars::values[bVar4];
      bVar5 = ECLookahead(this,1);
      local_32[0] = Chars<char16_t>::UTC((uint)(byte)ASCIIChars::values[bVar5] | (uint)bVar4 << 4);
      n = 2;
      goto LAB_00ed8302;
    }
    break;
  default:
    uVar17 = (ushort)local_32[0] - 0x24;
    uVar16 = (ulong)uVar17;
    if (uVar17 < 0x21) {
      if ((0x8000cf1UL >> (uVar16 & 0x3f) & 1) != 0) break;
      if (uVar16 == 0x1e) {
        deferredCharNode =
             (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x364470);
        (((MatchSetNode *)deferredCharNode)->super_Node).tag = WordBoundary;
        (((MatchSetNode *)deferredCharNode)->super_Node).features = 0;
        puVar1 = &(((MatchSetNode *)deferredCharNode)->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (((MatchSetNode *)deferredCharNode)->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (((MatchSetNode *)deferredCharNode)->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).prevConsumes.upper =
             0xffffffff;
        *(undefined8 *)&(((MatchSetNode *)deferredCharNode)->super_Node).thisConsumes.upper =
             0xffffffff;
        (((MatchSetNode *)deferredCharNode)->super_Node).followConsumes.upper = 0xffffffff;
        (((MatchSetNode *)deferredCharNode)->super_Node)._vptr_Node =
             (_func_int **)&PTR_LiteralLength_01542850;
        ((MatchSetNode *)deferredCharNode)->isNegation = true;
        ((MatchSetNode *)deferredCharNode)->needsEquivClass = false;
        goto LAB_00ed85ec;
      }
      if (uVar16 == 0x20) {
        cc = 'D';
        goto LAB_00ed8562;
      }
    }
    goto switchD_00ed7aec_caseD_54;
  }
switchD_00ed7aec_caseD_5b:
  deferredCharNode->cs[0] = local_32[0];
LAB_00ed7b2d:
  bVar3 = false;
LAB_00ed7b30:
  *node = &deferredCharNode->super_Node;
  return bVar3;
switchD_00ed7aec_caseD_54:
  if (this->unicodeFlagPresent == true) {
    Fail(this,-0x7ff5e9d6);
  }
  goto switchD_00ed7aec_caseD_5b;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        Assert(!IsEOF()); // checked for terminating 0 in pass 0
        if (standardEncodedChars->IsDigit(ECLookahead()))
        {
            // As per Annex B, allow octal escapes as well as group references, disambiguate based on known
            // number of groups.
            if (ECLookahead() == '0')
            {
                // fall through for octal
            }
            else
            {
                // Could be a group reference, but only if between 1 and 5 digits which resolve to a valid group number
                int n = 0;
                CharCount digits = 0;
                do
                {
                    n = n * 10 + (int)standardEncodedChars->DigitValue(ECLookahead(digits));
                    digits++;
                }
                while (digits < 5 && ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits)));
                if (n >= numGroups ||
                    (ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits))))
                {
                    if (standardEncodedChars->IsOctal(ECLookahead()))
                    {
                        // fall through for octal
                    }
                    else
                    {
                        // \8 and \9 are identity escapes
                        deferredCharNode->cs[0] = Chars<EncodedChar>::CTW(ECLookahead());
                        ECConsume();
                        node = deferredCharNode;
                        return false; // not an assertion
                    }
                }
                else
                {
                    ECConsume(digits);
                    node = Anew(ctAllocator, MatchGroupNode, n);
                    return false; // not an assertion
                }
            }

            // Must be between 1 and 3 octal digits
            Assert(standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) // Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal

            deferredCharNode->cs[0] = UTC((UChar)n);
            node = deferredCharNode;
            return false; // not an assertion
        }
        else if (ECLookahead() == 'c')
        {
            Char c;
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                c = UTC(Chars<EncodedChar>::CTU(ECLookahead(1)) % 32);
                ECConsume(2);
            }
            else
            {
                // SPEC DEVIATION: For non-letters or EOF, take the leading '\' to be itself, and
                //                 don't consume the 'c' or letter.
                c = '\\';
            }
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
        else
        {
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                node = Anew(ctAllocator, WordBoundaryNode, false);
                return true; // Is an assertion
            case 'B':
                node = Anew(ctAllocator, WordBoundaryNode, true);
                return true; // Is an assertion
            case 'f':
                c = '\f';
                break; // fall-through for identity escape
            case 'n':
                c = '\n';
                break; // fall-through for identity escape
            case 'r':
                c = '\r';
                break; // fall-through for identity escape
            case 't':
                c = '\t';
                break; // fall-through for identity escape
            case 'v':
                c = '\v';
                break; // fall-through for identity escape
            case 'd':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetDigits(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'D':
                {
                    node = GetNodeWithValidCharacterSet('D');
                    return false; // not an assertion
                }
            case 's':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetWhitespace(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'S':
                {
                    node = GetNodeWithValidCharacterSet('S');
                    return false; // not an assertion
                }
            case 'w':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    if (this->unicodeFlagPresent && this->caseInsensitiveFlagPresent)
                    {
                        standardChars->SetWordIUChars(ctAllocator, setNode->set);
                    }
                    else
                    {
                        standardChars->SetWordChars(ctAllocator, setNode->set);
                    }
                    node = setNode;
                    return false; // not an assertion
                }
            case 'W':
                {
                    node = GetNodeWithValidCharacterSet('W');
                    return false; // not an assertion
                }
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                        (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case 'u':
                if (unicodeFlagPresent && TryParseExtendedUnicodeEscape(c, previousSurrogatePart) > 0)
                    break;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    ECConsume(4);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case '^':
            case '$':
            case '\\':
            case '.':
            case '*':
            case '+':
            case '?':
            case '(':
            case ')':
            case '[':
            case ']':
            case '{':
            case '}':
            case '|':
            case '/':
                break; // fall-through for identity escape
            default:
                if (this->unicodeFlagPresent)
                {
                    // As per #sec-forbidden-extensions, if unicode flag is present, we must disallow any other escape.
                    this->Fail(JSERR_RegExpInvalidEscape); // throw SyntaxError
                }
                // As per Annex B, allow anything other than newlines and above. Embedded 0 is ok
                break;
            }

            // Must be an identity escape
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
    }